

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O2

void __thiscall
QGraphicsScenePrivate::unregisterTopLevelItem(QGraphicsScenePrivate *this,QGraphicsItem *item)

{
  uint uVar1;
  long in_FS_OFFSET;
  QGraphicsItem *local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = *(uint *)&this->field_0xb8;
  if ((uVar1 & 0x40) == 0) {
    uVar1 = uVar1 | (uint)((this->topLevelItems).d.size + -1 !=
                          (long)((item->d_ptr).d)->siblingIndex) << 6;
    *(uint *)&this->field_0xb8 = uVar1;
  }
  local_20 = item;
  if ((uVar1 & 0xc0) == 0x80) {
    QList<QGraphicsItem_*>::removeAt(&this->topLevelItems,(long)((item->d_ptr).d)->siblingIndex);
  }
  else {
    QtPrivate::sequential_erase_one<QList<QGraphicsItem*>,QGraphicsItem*>
              (&this->topLevelItems,&local_20);
    item = local_20;
  }
  ((item->d_ptr).d)->siblingIndex = -1;
  uVar1 = *(uint *)&this->field_0xb8;
  if ((char)uVar1 < '\0') {
    *(uint *)&this->field_0xb8 = (uVar1 & 0xffffff7f) + (uVar1 & 0x40) * 2 ^ 0x80;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsScenePrivate::unregisterTopLevelItem(QGraphicsItem *item)
{
    if (!holesInTopLevelSiblingIndex)
        holesInTopLevelSiblingIndex = item->d_ptr->siblingIndex != topLevelItems.size() - 1;
    if (topLevelSequentialOrdering && !holesInTopLevelSiblingIndex)
        topLevelItems.removeAt(item->d_ptr->siblingIndex);
    else
        topLevelItems.removeOne(item);
    // NB! Do not use topLevelItems.removeAt(item->d_ptr->siblingIndex) because
    // the item is not guaranteed to be at the index after the list is sorted
    // (see ensureSortedTopLevelItems()).
    item->d_ptr->siblingIndex = -1;
    if (topLevelSequentialOrdering)
        topLevelSequentialOrdering = !holesInTopLevelSiblingIndex;
}